

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_addclause(sat_solver *s,lit *begin,lit *end)

{
  uint *pEnd;
  int iVar1;
  int iVar2;
  uint *pBeg;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x5f0,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  pBeg = (uint *)(s->temp_clause).ptr;
  do {
    uVar6 = *begin;
    uVar7 = (s->temp_clause).size;
    if (uVar7 == (s->temp_clause).cap) {
      iVar2 = (uVar7 >> 1) * 3;
      if ((int)uVar7 < 4) {
        iVar2 = uVar7 * 2;
      }
      if (pBeg == (uint *)0x0) {
        pBeg = (uint *)malloc((long)iVar2 << 2);
      }
      else {
        pBeg = (uint *)realloc(pBeg,(long)iVar2 << 2);
      }
      (s->temp_clause).ptr = (int *)pBeg;
      if (pBeg == (uint *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->temp_clause).cap * 9.5367431640625e-07,
               (double)iVar2 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->temp_clause).cap = iVar2;
      uVar7 = (s->temp_clause).size;
    }
    (s->temp_clause).size = uVar7 + 1;
    pBeg[(int)uVar7] = uVar6;
    begin = (lit *)((uint *)begin + 1);
  } while (begin < end);
  iVar2 = (s->temp_clause).size;
  iVar5 = (int)*pBeg >> 1;
  pEnd = pBeg + iVar2;
  if (1 < (long)iVar2) {
    puVar3 = pBeg + 1;
    do {
      uVar6 = *puVar3;
      puVar4 = puVar3;
      iVar1 = (int)uVar6 >> 1;
      if ((int)uVar6 >> 1 <= iVar5) {
        iVar1 = iVar5;
      }
      for (; (iVar5 = iVar1, pBeg < puVar4 && ((int)uVar6 < (int)puVar4[-1])); puVar4 = puVar4 + -1)
      {
        *puVar4 = puVar4[-1];
        iVar1 = iVar5;
      }
      *puVar4 = uVar6;
      puVar3 = puVar3 + 1;
    } while (puVar3 < pEnd);
  }
  sat_solver_setnvars(s,iVar5 + 1);
  if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
     (iVar5 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)pBeg,(lit *)pEnd), iVar5 == 0)) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x60e,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  iVar5 = 0;
  if (0 < iVar2) {
    uVar6 = 0xfffffffe;
    puVar3 = pBeg;
    puVar4 = pBeg;
    do {
      uVar7 = *puVar3;
      if (((uVar7 ^ uVar6) == 1) || ((uVar7 & 1) == (int)s->assigns[(int)uVar7 >> 1]))
      goto LAB_004f2dd1;
      if (s->assigns[(int)uVar7 >> 1] == '\x03' && uVar7 != uVar6) {
        *puVar4 = uVar7;
        puVar4 = puVar4 + 1;
        uVar6 = uVar7;
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 < pEnd);
    if (puVar4 != pBeg) {
      if ((long)puVar4 - (long)pBeg == 4) {
        uVar6 = *pBeg;
        iVar2 = (int)uVar6 >> 1;
        if (s->pFreqs[iVar2] == '\0') {
          s->pFreqs[iVar2] = '\x01';
        }
        uVar7 = (uint)s->assigns[iVar2];
        if (uVar7 != 3) {
          return (uint)((uVar6 & 1) == uVar7);
        }
        s->assigns[iVar2] = (byte)uVar6 & 1;
        s->levels[iVar2] = (s->trail_lim).size;
        s->reasons[iVar2] = 0;
        iVar2 = s->qtail;
        s->qtail = iVar2 + 1;
        s->trail[iVar2] = uVar6;
      }
      else {
        sat_solver_clause_new(s,(lit *)pBeg,(lit *)puVar4,0);
      }
LAB_004f2dd1:
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int sat_solver_addclause(sat_solver* s, lit* begin, lit* end)
{
    int fVerbose = 0;
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( fVerbose )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver_setnvars(s,maxvar+1);

    ///////////////////////////////////
    // add clause to internal storage
    if ( s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, begin, end );
        assert( RetValue );
        (void) RetValue;
    }
    ///////////////////////////////////

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver_enqueue(s,*begin,0);

    // create new clause
    sat_solver_clause_new(s,begin,j,0);
    return true;
}